

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall TimesAll<0,_0,_0>::propagate(TimesAll<0,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  bool bVar3;
  long x_max;
  long z_max;
  long z_min;
  long y_max;
  long y_min;
  long x_min;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  x_min = (long)(pIVar1->min).v;
  x_max = (long)(pIVar1->max).v;
  y_min = (long)(pIVar2->min).v;
  y_max = (long)(pIVar2->max).v;
  bVar3 = propagate_z(this,x_min,x_max,y_min,y_max);
  if (bVar3) {
    pIVar1 = (this->z).var;
    z_min = (long)(pIVar1->min).v;
    z_max = (long)(pIVar1->max).v;
    bVar3 = TimesAll<0,0,0>::propagate_xy<0,0>
                      ((TimesAll<0,0,0> *)this,this->x,this->y,y_min,y_max,z_min,z_max);
    if (bVar3) {
      bVar3 = TimesAll<0,0,0>::propagate_xy<0,0>
                        ((TimesAll<0,0,0> *)this,this->y,this->x,x_min,x_max,z_min,z_max);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();

		// Propagating the bounds on z
		if (!propagate_z(x_min, x_max, y_min, y_max)) {
			return false;
		}

		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// Propagating the bounds on x
		if (!propagate_xy(x, y, y_min, y_max, z_min, z_max)) {
			return false;
		}

		// Propagating the bounds on y
		if (!propagate_xy(y, x, x_min, x_max, z_min, z_max)) {
			return false;
		}

		return true;
	}